

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void refineAndSquareBbox(vector<Bbox,_std::allocator<Bbox>_> *vecBbox,int *height,int *width)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ostream *this;
  reference pBVar6;
  pointer pBVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float local_7c;
  __normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_> local_58;
  __normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_> local_50;
  iterator it;
  float y2;
  float x2;
  float y1;
  float x1;
  float w;
  float h;
  float maxSide;
  float bbh;
  float bbw;
  int *width_local;
  int *height_local;
  vector<Bbox,_std::allocator<Bbox>_> *vecBbox_local;
  
  bVar5 = std::vector<Bbox,_std::allocator<Bbox>_>::empty(vecBbox);
  if (bVar5) {
    this = std::operator<<((ostream *)&std::cout,"Bbox is empty!!");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    it._M_current._4_4_ = 0.0;
    local_50._M_current = (Bbox *)std::vector<Bbox,_std::allocator<Bbox>_>::begin(vecBbox);
    while( true ) {
      local_58._M_current = (Bbox *)std::vector<Bbox,_std::allocator<Bbox>_>::end(vecBbox);
      bVar5 = __gnu_cxx::operator!=(&local_50,&local_58);
      if (!bVar5) break;
      pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
               operator*(&local_50);
      if ((pBVar6->exist & 1U) != 0) {
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        iVar1 = pBVar6->x2;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        fVar8 = (float)((iVar1 - pBVar6->x1) + 1);
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        iVar1 = pBVar6->y2;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        fVar9 = (float)((iVar1 - pBVar6->y1) + 1);
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        iVar1 = pBVar6->x1;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        fVar10 = pBVar6->regreCoord[1] * fVar8 + (float)iVar1;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        iVar1 = pBVar6->y1;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        fVar11 = pBVar6->regreCoord[0] * fVar9 + (float)iVar1;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        iVar1 = pBVar6->x2;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        fVar12 = pBVar6->regreCoord[3];
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        iVar2 = pBVar6->y2;
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        it._M_current._4_4_ = pBVar6->regreCoord[2] * fVar9 + (float)iVar2;
        fVar12 = ((fVar12 * fVar8 + (float)iVar1) - fVar10) + 1.0;
        fVar8 = (it._M_current._4_4_ - fVar11) + 1.0;
        local_7c = fVar8;
        if (fVar8 < fVar12) {
          local_7c = fVar12;
        }
        fVar12 = -local_7c * 0.5 + fVar12 * 0.5 + fVar10;
        fVar8 = -local_7c * 0.5 + fVar8 * 0.5 + fVar11;
        dVar13 = std::round((double)(ulong)(uint)((fVar12 + local_7c) - 1.0));
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        pBVar6->x2 = (int)SUB84(dVar13,0);
        dVar13 = std::round((double)(ulong)(uint)((fVar8 + local_7c) - 1.0));
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        pBVar6->y2 = (int)SUB84(dVar13,0);
        dVar13 = std::round((double)(ulong)(uint)fVar12);
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        pBVar6->x1 = (int)SUB84(dVar13,0);
        dVar13 = std::round((double)(ulong)(uint)fVar8);
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        pBVar6->y1 = (int)SUB84(dVar13,0);
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        if (pBVar6->x1 < 0) {
          pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                   operator*(&local_50);
          pBVar6->x1 = 0;
        }
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        if (pBVar6->y1 < 0) {
          pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                   operator*(&local_50);
          pBVar6->y1 = 0;
        }
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        if (*height < pBVar6->x2) {
          iVar1 = *height;
          pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                   operator*(&local_50);
          pBVar6->x2 = iVar1 + -1;
        }
        pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator*(&local_50);
        if (*width < pBVar6->y2) {
          iVar1 = *width;
          pBVar6 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                   operator*(&local_50);
          pBVar6->y2 = iVar1 + -1;
        }
        pBVar7 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator->(&local_50);
        iVar1 = pBVar7->x2;
        pBVar7 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator->(&local_50);
        iVar2 = pBVar7->x1;
        pBVar7 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator->(&local_50);
        iVar3 = pBVar7->y2;
        pBVar7 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator->(&local_50);
        iVar4 = pBVar7->y1;
        pBVar7 = __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::
                 operator->(&local_50);
        pBVar7->area = (float)((iVar1 - iVar2) * (iVar3 - iVar4));
      }
      __gnu_cxx::__normal_iterator<Bbox_*,_std::vector<Bbox,_std::allocator<Bbox>_>_>::operator++
                (&local_50,0);
    }
  }
  return;
}

Assistant:

void refineAndSquareBbox(vector<struct Bbox> &vecBbox, const int &height, const int &width) {
    if (vecBbox.empty()) {
        cout << "Bbox is empty!!" << endl;
        return;
    }
    float bbw = 0, bbh = 0, maxSide = 0;
    float h = 0, w = 0;
    float x1 = 0, y1 = 0, x2 = 0, y2 = 0;
    for (vector<struct Bbox>::iterator it = vecBbox.begin(); it != vecBbox.end(); it++) {
        if ((*it).exist) {
            bbh = (*it).x2 - (*it).x1 + 1;
            bbw = (*it).y2 - (*it).y1 + 1;
            x1 = (*it).x1 + (*it).regreCoord[1] * bbh;
            y1 = (*it).y1 + (*it).regreCoord[0] * bbw;
            x2 = (*it).x2 + (*it).regreCoord[3] * bbh;
            y2 = (*it).y2 + (*it).regreCoord[2] * bbw;

            h = x2 - x1 + 1;
            w = y2 - y1 + 1;

            maxSide = (h > w) ? h : w;
            x1 = x1 + h * 0.5 - maxSide * 0.5;
            y1 = y1 + w * 0.5 - maxSide * 0.5;
            (*it).x2 = round(x1 + maxSide - 1);
            (*it).y2 = round(y1 + maxSide - 1);
            (*it).x1 = round(x1);
            (*it).y1 = round(y1);

            //boundary check
            if ((*it).x1 < 0)(*it).x1 = 0;
            if ((*it).y1 < 0)(*it).y1 = 0;
            if ((*it).x2 > height)(*it).x2 = height - 1;
            if ((*it).y2 > width)(*it).y2 = width - 1;

            it->area = (it->x2 - it->x1) * (it->y2 - it->y1);
        }
    }
}